

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  char cVar1;
  bool bVar2;
  Curl_addrinfo *pCVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  Curl_addrinfo *pCVar8;
  void *pvVar9;
  Curl_dns_entry *pCVar10;
  Curl_addrinfo *ai;
  size_t alen;
  size_t hlen_1;
  char *host_begin;
  _Bool error;
  unsigned_long tmp_port;
  char *pcStack_1e8;
  _Bool permanent;
  char *end_ptr;
  char *pcStack_1d8;
  int port;
  char *port_ptr;
  char *addr_end;
  char *addr_begin;
  char *addresses;
  char address [64];
  size_t entry_len_1;
  Curl_addrinfo *tail;
  Curl_addrinfo *head;
  Curl_dns_entry *dns;
  size_t hlen;
  size_t entry_len;
  unsigned_long num;
  char entry_id [262];
  char *local_28;
  char *host_end;
  curl_slist *hostp;
  Curl_easy *data_local;
  
  *(uint *)&(data->state).field_0x774 = *(uint *)&(data->state).field_0x774 & 0xfffeffff;
  host_end = (char *)(data->state).resolve;
  do {
    if (host_end == (char *)0x0) {
      (data->state).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    if (*(long *)host_end != 0) {
      if (**(char **)host_end == '-') {
        entry_len = 0;
        dns = (Curl_dns_entry *)0x0;
        local_28 = strchr((char *)(*(long *)host_end + 1),0x3a);
        if (local_28 != (char *)0x0) {
          dns = (Curl_dns_entry *)(local_28 + -(*(long *)host_end + 1));
          local_28 = local_28 + 1;
          entry_len = strtoul(local_28,(char **)0x0,10);
          if ((dns == (Curl_dns_entry *)0x0) || (0xffff < entry_len)) {
            local_28 = (char *)0x0;
          }
        }
        if (local_28 == (char *)0x0) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"Bad syntax CURLOPT_RESOLVE removal entry \'%s\'",
                       *(undefined8 *)host_end);
          }
        }
        else {
          sVar4 = create_hostcache_id((char *)(*(long *)host_end + 1),(size_t)dns,(int)entry_len,
                                      (char *)&num,0x106);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,&num,sVar4 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
        }
      }
      else {
        tail = (Curl_addrinfo *)0x0;
        entry_len_1 = 0;
        addr_begin = (char *)0x0;
        end_ptr._4_4_ = 0;
        bVar2 = true;
        hlen_1 = *(size_t *)host_end;
        alen = 0;
        cVar1 = *(char *)hlen_1;
        if (cVar1 == '+') {
          hlen_1 = hlen_1 + 1;
        }
        tmp_port._7_1_ = cVar1 != '+';
        pcVar5 = strchr((char *)hlen_1,0x3a);
        if (pcVar5 != (char *)0x0) {
          alen = (long)pcVar5 - hlen_1;
          pcStack_1d8 = pcVar5 + 1;
          uVar6 = strtoul(pcStack_1d8,&stack0xfffffffffffffe18,10);
          if (((uVar6 < 0x10000) && (pcStack_1e8 != pcStack_1d8)) && (*pcStack_1e8 == ':')) {
            end_ptr._4_4_ = (uint)uVar6;
            addr_begin = pcStack_1e8 + 1;
            pCVar8 = (Curl_addrinfo *)entry_len_1;
            pCVar3 = tail;
            while (tail = pCVar3, entry_len_1 = (size_t)pCVar8, *pcStack_1e8 != '\0') {
              addr_end = pcStack_1e8 + 1;
              port_ptr = strchr(addr_end,0x2c);
              pcVar5 = addr_end;
              if (port_ptr == (char *)0x0) {
                sVar7 = strlen(addr_end);
                port_ptr = pcVar5 + sVar7;
              }
              pcStack_1e8 = port_ptr;
              if (*addr_end == '[') {
                if ((port_ptr == addr_end) || (port_ptr[-1] != ']')) goto LAB_001489f6;
                addr_end = addr_end + 1;
                port_ptr = port_ptr + -1;
              }
              uVar6 = (long)port_ptr - (long)addr_end;
              pCVar8 = (Curl_addrinfo *)entry_len_1;
              pCVar3 = tail;
              if (uVar6 != 0) {
                if (0x3f < uVar6) goto LAB_001489f6;
                memcpy(&addresses,addr_end,uVar6);
                address[uVar6 - 8] = '\0';
                pCVar8 = Curl_str2addr((char *)&addresses,end_ptr._4_4_);
                if (pCVar8 == (Curl_addrinfo *)0x0) {
                  if (((data != (Curl_easy *)0x0) &&
                      ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
                     (((data->state).feat == (curl_trc_feat *)0x0 ||
                      (0 < ((data->state).feat)->log_level)))) {
                    Curl_infof(data,"Resolve address \'%s\' found illegal",&addresses);
                  }
                  goto LAB_001489f6;
                }
                pCVar3 = pCVar8;
                if (entry_len_1 != 0) {
                  *(Curl_addrinfo **)(entry_len_1 + 0x28) = pCVar8;
                  pCVar8 = (Curl_addrinfo *)*(size_t *)(entry_len_1 + 0x28);
                  pCVar3 = tail;
                }
              }
            }
            if (tail != (Curl_addrinfo *)0x0) {
              bVar2 = false;
            }
          }
        }
LAB_001489f6:
        if (bVar2) {
          Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",*(undefined8 *)host_end);
          Curl_freeaddrinfo(tail);
          return CURLE_SETOPT_OPTION_SYNTAX;
        }
        sVar4 = create_hostcache_id((char *)hlen_1,alen,end_ptr._4_4_,(char *)&num,0x106);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pvVar9 = Curl_hash_pick((data->dns).hostcache,&num,sVar4 + 1);
        if (pvVar9 != (void *)0x0) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"RESOLVE %.*s:%d - old addresses discarded",alen & 0xffffffff,hlen_1,
                       (ulong)end_ptr._4_4_);
          }
          Curl_hash_delete((data->dns).hostcache,&num,sVar4 + 1);
        }
        pCVar10 = Curl_cache_addr(data,tail,(char *)hlen_1,alen,end_ptr._4_4_,tmp_port._7_1_);
        if (pCVar10 != (Curl_dns_entry *)0x0) {
          pCVar10->refcount = pCVar10->refcount - 1;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (pCVar10 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo(tail);
          return CURLE_OUT_OF_MEMORY;
        }
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          pcVar5 = " (non-permanent)";
          if (tmp_port._7_1_) {
            pcVar5 = "";
          }
          Curl_infof(data,"Added %.*s:%d:%s to DNS cache%s",alen & 0xffffffff,hlen_1,
                     (ulong)end_ptr._4_4_,addr_begin,pcVar5);
        }
        if ((alen == 1) && (*(char *)hlen_1 == '*')) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)
              ) && (((data->state).feat == (curl_trc_feat *)0x0 ||
                    (0 < ((data->state).feat)->log_level)))) {
            Curl_infof(data,"RESOLVE *:%d using wildcard",(ulong)end_ptr._4_4_);
          }
          *(uint *)&(data->state).field_0x774 =
               *(uint *)&(data->state).field_0x774 & 0xfffeffff | 0x10000;
        }
      }
    }
    host_end = *(char **)(host_end + 8);
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char *host_end;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      unsigned long num = 0;
      size_t entry_len;
      size_t hlen = 0;
      host_end = strchr(&hostp->data[1], ':');

      if(host_end) {
        hlen = host_end - &hostp->data[1];
        num = strtoul(++host_end, NULL, 10);
        if(!hlen || (num > 0xffff))
          host_end = NULL;
      }
      if(!host_end) {
        infof(data, "Bad syntax CURLOPT_RESOLVE removal entry '%s'",
              hostp->data);
        continue;
      }
      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(&hostp->data[1], hlen, (int)num,
                                      entry_id, sizeof(entry_id));
      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it did not exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      char *addresses = NULL;
#endif
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      int port = 0;
      char *end_ptr;
      bool permanent = TRUE;
      unsigned long tmp_port;
      bool error = TRUE;
      char *host_begin = hostp->data;
      size_t hlen = 0;

      if(host_begin[0] == '+') {
        host_begin++;
        permanent = FALSE;
      }
      host_end = strchr(host_begin, ':');
      if(!host_end)
        goto err;
      hlen = host_end - host_begin;

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = end_ptr + 1;
#endif

      while(*end_ptr) {
        size_t alen;
        struct Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef USE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_hostcache_id(host_begin, hlen, port,
                                      entry_id, sizeof(entry_id));

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%d - old addresses discarded",
              (int)hlen, host_begin, port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = Curl_cache_addr(data, head, host_begin, hlen, port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%d:%s to DNS cache%s",
            (int)hlen, host_begin, port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if((hlen == 1) && (host_begin[0] == '*')) {
        infof(data, "RESOLVE *:%d using wildcard", port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}